

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageUtil.cpp
# Opt level: O2

int __thiscall
vkt::pipeline::TestTextureCube::copy(TestTextureCube *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  TestTextureCube *this_00;
  TextureFormat local_28;
  
  local_28 = (TextureFormat)src;
  this_00 = (TestTextureCube *)operator_new(0x188);
  TestTextureCube(this_00,&local_28,*(int *)(dst + 0x28));
  (this->super_TestTexture)._vptr_TestTexture = (_func_int **)this_00;
  TestTexture::copyToTexture((TestTexture *)dst,(TestTexture *)this_00);
  return (int)this;
}

Assistant:

de::MovePtr<TestTexture> TestTextureCube::copy(const tcu::TextureFormat format) const
{
	DE_ASSERT(!isCompressed());

	de::MovePtr<TestTexture>	texture	(new TestTextureCube(format, m_texture.getSize()));

	copyToTexture(*texture);

	return texture;
}